

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

double xmlXPathCastNodeSetToNumber(xmlNodeSetPtr ns)

{
  xmlChar *val;
  double ret;
  xmlChar *str;
  xmlNodeSetPtr ns_local;
  
  if (ns == (xmlNodeSetPtr)0x0) {
    ns_local = (xmlNodeSetPtr)0x7ff8000000000000;
  }
  else {
    val = xmlXPathCastNodeSetToString(ns);
    ns_local = (xmlNodeSetPtr)xmlXPathCastStringToNumber(val);
    (*xmlFree)(val);
  }
  return (double)ns_local;
}

Assistant:

double
xmlXPathCastNodeSetToNumber (xmlNodeSetPtr ns) {
    xmlChar *str;
    double ret;

    if (ns == NULL)
	return(NAN);
    str = xmlXPathCastNodeSetToString(ns);
    ret = xmlXPathCastStringToNumber(str);
    xmlFree(str);
    return(ret);
}